

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
ast::InitStmt::toString_abi_cxx11_(string *__return_storage_ptr__,InitStmt *this)

{
  ostream *poVar1;
  ostringstream msg;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"init ",5);
  ast::operator<<((ostream *)local_190,this->variable);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," = ",3);
  poVar1 = ast::operator<<((ostream *)local_190,this->value);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::InitStmt::toString() const
{
    std::ostringstream msg;
    msg << "init ";
    msg << variable;
    msg << " = ";
    msg << value << std::endl;
    return msg.str();
}